

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  int iVar1;
  FieldDescriptor *pFVar2;
  undefined4 in_EDX;
  DescriptorPool *in_RSI;
  Descriptor *in_RDI;
  bool bVar3;
  FieldDescriptor *result;
  MutexLockMaybe lock;
  FieldDescriptor *result_1;
  ReaderMutexLock lock_1;
  int in_stack_0000009c;
  Descriptor *in_stack_000000a0;
  DescriptorPool *in_stack_000000a8;
  Mutex *in_stack_ffffffffffffff78;
  FieldDescriptor *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffffa0;
  int number_00;
  Tables *in_stack_ffffffffffffffb0;
  Tables *this_00;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  FieldDescriptor *local_8;
  
  number_00 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  iVar1 = Descriptor::extension_range_count((Descriptor *)in_RSI);
  if (iVar1 == 0) {
    return (FieldDescriptor *)0x0;
  }
  if (*(long *)in_RDI != 0) {
    internal::MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
    ;
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4ab00e);
    pFVar2 = Tables::FindExtension(in_stack_ffffffffffffffb0,in_RDI,number_00);
    bVar3 = pFVar2 != (FieldDescriptor *)0x0;
    if (bVar3) {
      local_8 = pFVar2;
    }
    internal::MutexLock::~MutexLock((MutexLock *)0x4ab07e);
    number_00 = (int)((ulong)pFVar2 >> 0x20);
    if (bVar3) {
      return local_8;
    }
  }
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (*(long *)(in_RDI + 8) != 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4ab0bb);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4ab0c7);
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4ab0d5);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4ab0e1);
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4ab0ef);
  local_8 = Tables::FindExtension(in_stack_ffffffffffffffb0,in_RDI,number_00);
  if ((local_8 == (FieldDescriptor *)0x0) &&
     ((*(long *)(in_RDI + 0x18) == 0 ||
      (local_8 = FindExtensionByNumber
                           (in_RSI,(Descriptor *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc), local_8 == (FieldDescriptor *)0x0)))) {
    this_00 = (Tables *)0x0;
    bVar3 = TryFindExtensionInFallbackDatabase
                      (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
    if (bVar3) {
      std::
      unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
      ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    *)0x4ab1d9);
      in_stack_ffffffffffffff80 = Tables::FindExtension(this_00,in_RDI,number_00);
      local_8 = in_stack_ffffffffffffff80;
      if (in_stack_ffffffffffffff80 != (FieldDescriptor *)0x0) goto LAB_004ab230;
    }
    local_8 = (FieldDescriptor *)0x0;
  }
LAB_004ab230:
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)in_stack_ffffffffffffff80);
  return local_8;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  // A faster path to reduce lock contention in finding extensions, assuming
  // most extensions will be cache hit.
  if (mutex_ != nullptr) {
    ReaderMutexLock lock(mutex_);
    const FieldDescriptor* result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }
  if (underlay_ != nullptr) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != nullptr) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  return nullptr;
}